

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTestListener.cpp
# Opt level: O0

void __thiscall
rc::detail::LogTestListener::onShrinkTried
          (LogTestListener *this,CaseDescription *param_1,bool accepted)

{
  bool accepted_local;
  CaseDescription *param_1_local;
  LogTestListener *this_local;
  
  if ((this->m_verboseShrinking & 1U) != 0) {
    if (accepted) {
      std::operator<<(this->m_out,"!");
    }
    else {
      std::operator<<(this->m_out,".");
    }
  }
  return;
}

Assistant:

void LogTestListener::onShrinkTried(const CaseDescription &/*shrink*/,
                                    bool accepted) {
  if (!m_verboseShrinking) {
    return;
  }

  if (accepted) {
    m_out << "!";
  } else {
    m_out << ".";
  }
}